

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
Serialize<FDynamicColormap>(FSerializer *arc,char *key,FDynamicColormap **cm,FDynamicColormap **def)

{
  FWriter *pFVar1;
  FDynamicColormap *pFVar2;
  PalEntry color;
  PalEntry fade;
  uint uVar3;
  Value *this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_02;
  FDynamicColormap *pFVar4;
  
  pFVar1 = arc->w;
  if (pFVar1 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      if ((this->data_).f.flags == 4) {
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,0);
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,1);
        this_02 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,2);
        if ((((*(byte *)((long)&this_00->data_ + 0x16) & 0x40) != 0) &&
            ((*(byte *)((long)&this_01->data_ + 0x16) & 0x40) != 0)) &&
           ((*(byte *)((long)&this_02->data_ + 0x16) & 0x40) != 0)) {
          color.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetUint(this_00);
          fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                         rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::GetUint(this_01);
          uVar3 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(this_02);
          pFVar4 = GetSpecialLights(color,fade,uVar3);
          *cm = pFVar4;
          return arc;
        }
      }
      __assert_fail("false && \"not a colormap\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x6d3,
                    "FSerializer &Serialize(FSerializer &, const char *, FDynamicColormap *&, FDynamicColormap **)"
                   );
    }
  }
  else {
    uVar3 = (pFVar1->mInObject).Count;
    if (((uVar3 != 0) && (def != (FDynamicColormap **)0x0)) &&
       ((pFVar1->mInObject).Array[uVar3 - 1] != false)) {
      pFVar4 = *cm;
      pFVar2 = *def;
      if ((((pFVar4->Color).field_0.d == (pFVar2->Color).field_0.d) &&
          ((pFVar4->Fade).field_0.d == (pFVar2->Fade).field_0.d)) &&
         (pFVar4->Desaturate == pFVar2->Desaturate)) {
        return arc;
      }
    }
    FSerializer::WriteKey(arc,key);
    FWriter::StartArray(arc->w);
    FWriter::Uint(arc->w,((*cm)->Color).field_0.d);
    FWriter::Uint(arc->w,((*cm)->Fade).field_0.d);
    FWriter::Uint(arc->w,(*cm)->Desaturate);
    FWriter::EndArray(arc->w);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FDynamicColormap *&cm, FDynamicColormap **def)
{
	if (arc.isWriting())
	{
		if (arc.w->inObject() && def != nullptr && cm->Color == (*def)->Color && cm->Fade == (*def)->Fade && cm->Desaturate == (*def)->Desaturate)
		{
			return arc;
		}

		arc.WriteKey(key);
		arc.w->StartArray();
		arc.w->Uint(cm->Color);
		arc.w->Uint(cm->Fade);
		arc.w->Uint(cm->Desaturate);
		arc.w->EndArray();
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				const rapidjson::Value &colorval = (*val)[0];
				const rapidjson::Value &fadeval = (*val)[1];
				const rapidjson::Value &desatval = (*val)[2];
				if (colorval.IsUint() && fadeval.IsUint() && desatval.IsUint())
				{
					cm = GetSpecialLights(colorval.GetUint(), fadeval.GetUint(), desatval.GetUint());
					return arc;
				}
			}
			assert(false && "not a colormap");
			Printf(TEXTCOLOR_RED "object does not represent a colormap for '%s'", key);
			cm = &NormalLight;
		}
	}
	return arc;
}